

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogTailIdx.cpp
# Opt level: O2

list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
liblogger::LogTailIdx::GetList_abi_cxx11_
          (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,LogTailIdx *this)

{
  _Base_ptr p_Var1;
  LogManagerScopedLock lock;
  LogManagerScopedLock local_19;
  
  LogManager::Lock();
  local_19.m_locked = true;
  p_Var1 = (this->m_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node._M_size = 0;
  if ((_Rb_tree_header *)p_Var1 == &(this->m_data)._M_t._M_impl.super__Rb_tree_header) {
    LogManagerScopedLock::~LogManagerScopedLock(&local_19);
    return __return_storage_ptr__;
  }
  do {
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&p_Var1[1]._M_parent);
  } while( true );
}

Assistant:

std::list<std::string> LogTailIdx::GetList() {
	LogManagerScopedLock lock = LogManagerScopedLock();
	std::map<uint64_t, std::string>::iterator it = m_data.begin();
	std::list<std::string> lst;
	while(it != m_data.end())
	{
		lst.push_back(it->second);
	}
	return lst;
}